

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

PointAttribute * __thiscall
draco::PointCloud::GetAttributeByUniqueId(PointCloud *this,uint32_t unique_id)

{
  int32_t iVar1;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *in_RDI;
  int32_t att_id;
  PointCloud *in_stack_fffffffffffffff8;
  pointer pPVar2;
  
  iVar1 = GetAttributeIdByUniqueId(in_stack_fffffffffffffff8,(uint32_t)((ulong)in_RDI >> 0x20));
  if (iVar1 == -1) {
    pPVar2 = (pointer)0x0;
  }
  else {
    std::
    vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
    ::operator[]((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  *)(in_RDI + 2),(long)iVar1);
    pPVar2 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
             get(in_RDI);
  }
  return pPVar2;
}

Assistant:

const PointAttribute *PointCloud::GetAttributeByUniqueId(
    uint32_t unique_id) const {
  const int32_t att_id = GetAttributeIdByUniqueId(unique_id);
  if (att_id == -1) {
    return nullptr;
  }
  return attributes_[att_id].get();
}